

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmEndForEachCommand::InvokeInitialPass
          (cmEndForEachCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  allocator local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1_local;
  cmEndForEachCommand *this_local;
  
  local_20 = param_2;
  param_2_local = (cmExecutionStatus *)param_1;
  param_1_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
             ,&local_41);
  cmCommand::SetError(&this->super_cmCommand,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return false;
}

Assistant:

bool cmEndForEachCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDFOREACH command was found outside of a proper "
                 "FOREACH ENDFOREACH structure. Or its arguments did "
                 "not match the opening FOREACH command.");
  return false;
}